

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# launch.c
# Opt level: O1

void authenticate_and_launch(void)

{
  char response [8];
  undefined4 local_10;
  undefined3 uStack_c;
  
  printf("Secret: ");
  gets((char *)&local_10);
  if (CONCAT31(uStack_c,local_10._3_1_) == 0x617568 && local_10 == 0x68736f4a) {
    puts("Access granted");
    printf("Launching %d missiles\n",2);
  }
  else {
    puts("Access denied");
  }
  return;
}

Assistant:

void authenticate_and_launch(void) {
  int n_missiles = 2;
  bool allowaccess = false;
  char response[8];

  printf("Secret: ");
  gets(response);

  if (strcmp(response, "Joshua") == 0)
    allowaccess = true;

  if (allowaccess) {
    puts("Access granted");
    launch_missiles(n_missiles);
  }

  if (!allowaccess)
    puts("Access denied");
}